

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadGlobalHeader
          (BinaryReader *this,Type *out_type,bool *out_mutable)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  byte local_31;
  Type TStack_30;
  uint8_t mutable_;
  Type global_type;
  bool *out_mutable_local;
  Type *out_type_local;
  BinaryReader *this_local;
  
  global_type = (Type)out_mutable;
  Type::Type(&stack0xffffffffffffffd0,Void);
  local_31 = 0;
  RVar2 = ReadType(this,&stack0xffffffffffffffd0,"global type");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = IsConcreteType(this,TStack_30);
    if (bVar1) {
      RVar2 = ReadU8(this,&local_31,"global mutability");
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else if (local_31 < 2) {
        *out_type = TStack_30;
        *(bool *)global_type = local_31 != 0;
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      else {
        PrintError(this,"global mutability must be 0 or 1");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      EVar3 = Type::operator_cast_to_Enum(&stack0xffffffffffffffd0);
      PrintError(this,"invalid global type: %#x",(ulong)(uint)EVar3);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadGlobalHeader(Type* out_type, bool* out_mutable) {
  Type global_type = Type::Void;
  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadType(&global_type, "global type"));
  ERROR_UNLESS(IsConcreteType(global_type), "invalid global type: %#x",
               static_cast<int>(global_type));

  CHECK_RESULT(ReadU8(&mutable_, "global mutability"));
  ERROR_UNLESS(mutable_ <= 1, "global mutability must be 0 or 1");

  *out_type = global_type;
  *out_mutable = mutable_;
  return Result::Ok;
}